

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# publisher_link.cpp
# Opt level: O0

bool __thiscall miniros::PublisherLink::setHeader(PublisherLink *this,Header *header)

{
  bool bVar1;
  undefined1 uVar2;
  byte bVar3;
  byte bVar4;
  uint32_t uVar5;
  ConnectionManager *this_00;
  string *in_RSI;
  long in_RDI;
  SubscriptionPtr parent;
  string latched_str;
  string type;
  string md5sum;
  enable_shared_from_this<miniros::PublisherLink> *in_stack_fffffffffffffe38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe40;
  undefined4 in_stack_fffffffffffffe48;
  undefined6 in_stack_fffffffffffffe58;
  undefined1 in_stack_fffffffffffffe5e;
  undefined1 in_stack_fffffffffffffe5f;
  string *in_stack_fffffffffffffe60;
  string *psVar6;
  Header *in_stack_fffffffffffffe68;
  Header *this_01;
  undefined6 in_stack_fffffffffffffe70;
  undefined1 in_stack_fffffffffffffe76;
  undefined1 in_stack_fffffffffffffe77;
  char *in_stack_fffffffffffffe78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_02;
  __shared_ptr local_138 [23];
  undefined1 local_121 [40];
  undefined1 local_f9 [33];
  undefined4 local_d8;
  allocator<char> local_d1;
  string local_d0 [32];
  string local_b0 [32];
  string local_90 [32];
  string local_70 [55];
  allocator<char> local_39;
  string local_38 [32];
  string *local_18;
  byte local_1;
  
  local_18 = in_RSI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffe80,in_stack_fffffffffffffe78,
             (allocator<char> *)
             CONCAT17(in_stack_fffffffffffffe77,
                      CONCAT16(in_stack_fffffffffffffe76,in_stack_fffffffffffffe70)));
  Header::getValue(in_stack_fffffffffffffe68,in_stack_fffffffffffffe60,
                   (string *)
                   CONCAT17(in_stack_fffffffffffffe5f,
                            CONCAT16(in_stack_fffffffffffffe5e,in_stack_fffffffffffffe58)));
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator(&local_39);
  std::__cxx11::string::string(local_70);
  std::__cxx11::string::string(local_90);
  std::__cxx11::string::string(local_b0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffe80,in_stack_fffffffffffffe78,
             (allocator<char> *)
             CONCAT17(in_stack_fffffffffffffe77,
                      CONCAT16(in_stack_fffffffffffffe76,in_stack_fffffffffffffe70)));
  bVar1 = Header::getValue(in_stack_fffffffffffffe68,in_stack_fffffffffffffe60,
                           (string *)
                           CONCAT17(in_stack_fffffffffffffe5f,
                                    CONCAT16(in_stack_fffffffffffffe5e,in_stack_fffffffffffffe58)));
  std::__cxx11::string::~string(local_d0);
  std::allocator<char>::~allocator(&local_d1);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    std::__cxx11::string::operator=((string *)(in_RDI + 0xe8),local_70);
    this_02 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f9;
    psVar6 = local_18;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (this_02,(char *)psVar6,
               (allocator<char> *)
               CONCAT17(in_stack_fffffffffffffe77,
                        CONCAT16(in_stack_fffffffffffffe76,in_stack_fffffffffffffe70)));
    uVar2 = Header::getValue(in_stack_fffffffffffffe68,in_stack_fffffffffffffe60,
                             (string *)
                             CONCAT17(in_stack_fffffffffffffe5f,
                                      CONCAT16(in_stack_fffffffffffffe5e,in_stack_fffffffffffffe58))
                            );
    bVar3 = uVar2 ^ 0xff;
    std::__cxx11::string::~string((string *)(local_f9 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_f9);
    if ((bVar3 & 1) == 0) {
      *(undefined1 *)(in_RDI + 0xb0) = 0;
      this_01 = (Header *)local_121;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (this_02,(char *)psVar6,
                 (allocator<char> *)CONCAT17(uVar2,CONCAT16(bVar3,in_stack_fffffffffffffe70)));
      bVar4 = Header::getValue(this_01,local_18,
                               (string *)
                               CONCAT17(in_stack_fffffffffffffe5f,
                                        CONCAT16(in_stack_fffffffffffffe5e,in_stack_fffffffffffffe58
                                                )));
      std::__cxx11::string::~string((string *)(local_121 + 1));
      std::allocator<char>::~allocator((allocator<char> *)local_121);
      psVar6 = local_18;
      if (((bVar4 & 1) != 0) &&
         (bVar1 = std::operator==(in_stack_fffffffffffffe40,(char *)in_stack_fffffffffffffe38),
         psVar6 = local_18, bVar1)) {
        *(undefined1 *)(in_RDI + 0xb0) = 1;
      }
      this_00 = (ConnectionManager *)ConnectionManager::instance();
      std::__shared_ptr_access<miniros::ConnectionManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>
      ::operator->((__shared_ptr_access<miniros::ConnectionManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x494cce);
      uVar5 = ConnectionManager::getNewConnectionID(this_00);
      *(uint32_t *)(in_RDI + 0x28) = uVar5;
      Header::operator=((Header *)in_stack_fffffffffffffe40,(Header *)in_stack_fffffffffffffe38);
      std::weak_ptr<miniros::Subscription>::lock
                ((weak_ptr<miniros::Subscription> *)CONCAT44(uVar5,in_stack_fffffffffffffe48));
      bVar1 = std::__shared_ptr::operator_cast_to_bool(local_138);
      if (bVar1) {
        std::__shared_ptr_access<miniros::Subscription,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<miniros::Subscription,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x494d35);
        std::enable_shared_from_this<miniros::PublisherLink>::shared_from_this
                  (in_stack_fffffffffffffe38);
        Subscription::headerReceived
                  ((Subscription *)CONCAT17(uVar2,CONCAT16(bVar3,in_stack_fffffffffffffe70)),
                   (PublisherLinkPtr *)this_01,(Header *)psVar6);
        std::shared_ptr<miniros::PublisherLink>::~shared_ptr
                  ((shared_ptr<miniros::PublisherLink> *)0x494d7b);
      }
      std::shared_ptr<miniros::Subscription>::~shared_ptr
                ((shared_ptr<miniros::Subscription> *)0x494dc3);
      local_1 = 1;
    }
    else {
      local_1 = 0;
    }
  }
  else {
    local_1 = 0;
  }
  local_d8 = 1;
  std::__cxx11::string::~string(local_b0);
  std::__cxx11::string::~string(local_90);
  std::__cxx11::string::~string(local_70);
  return (bool)(local_1 & 1);
}

Assistant:

bool PublisherLink::setHeader(const Header& header)
{
  header.getValue("callerid", caller_id_);

  std::string md5sum, type, latched_str;
  if (!header.getValue("md5sum", md5sum))
  {
    MINIROS_ASSERT("Publisher header did not have required element: md5sum");
    return false;
  }

  md5sum_ = md5sum;

  if (!header.getValue("type", type))
  {
    MINIROS_ASSERT("Publisher header did not have required element: type");
    return false;
  }

  latched_ = false;
  if (header.getValue("latching", latched_str))
  {
    if (latched_str == "1")
    {
      latched_ = true;
    }
  }

  connection_id_ = ConnectionManager::instance()->getNewConnectionID();
  header_ = header;

  if (SubscriptionPtr parent = parent_.lock())
  {
    parent->headerReceived(shared_from_this(), header);
  }

  return true;
}